

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

int __thiscall
QUtil::call_main_from_wmain
          (QUtil *this,int argc,wchar_t **argv,function<int_(int,_char_**)> *realmain)

{
  int iVar1;
  function<int_(int,_char_**)> fStack_38;
  
  std::function<int_(int,_char_**)>::function(&fStack_38,(function<int_(int,_char_**)> *)argv);
  iVar1 = ::call_main_from_wmain(SUB81(this,0),argc,(wchar_t **)&fStack_38,realmain);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  return iVar1;
}

Assistant:

int
QUtil::call_main_from_wmain(int argc, wchar_t* argv[], std::function<int(int, char*[])> realmain)
{
    return ::call_main_from_wmain(true, argc, argv, realmain);
}